

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ExpressionConstraintSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ExpressionConstraintSyntax,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token>
          (BumpAllocator *this,Token *args,ExpressionSyntax *args_1,Token *args_2)

{
  Info *pIVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  ExpressionConstraintSyntax *pEVar11;
  
  pEVar11 = (ExpressionConstraintSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ExpressionConstraintSyntax *)this->endPtr < pEVar11 + 1) {
    pEVar11 = (ExpressionConstraintSyntax *)allocateSlow(this,0x40,8);
  }
  else {
    this->head->current = (byte *)(pEVar11 + 1);
  }
  TVar3 = args->kind;
  uVar4 = args->field_0x2;
  NVar5.raw = (args->numFlags).raw;
  uVar6 = args->rawLen;
  pIVar1 = args->info;
  TVar7 = args_2->kind;
  uVar8 = args_2->field_0x2;
  NVar9.raw = (args_2->numFlags).raw;
  uVar10 = args_2->rawLen;
  pIVar2 = args_2->info;
  (pEVar11->super_ConstraintItemSyntax).super_SyntaxNode.kind = ExpressionConstraint;
  (pEVar11->super_ConstraintItemSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pEVar11->super_ConstraintItemSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pEVar11->soft).kind = TVar3;
  (pEVar11->soft).field_0x2 = uVar4;
  (pEVar11->soft).numFlags = (NumericTokenFlags)NVar5.raw;
  (pEVar11->soft).rawLen = uVar6;
  (pEVar11->soft).info = pIVar1;
  (pEVar11->expr).ptr = args_1;
  (pEVar11->semi).kind = TVar7;
  (pEVar11->semi).field_0x2 = uVar8;
  (pEVar11->semi).numFlags = (NumericTokenFlags)NVar9.raw;
  (pEVar11->semi).rawLen = uVar10;
  (pEVar11->semi).info = pIVar2;
  (args_1->super_SyntaxNode).parent = (SyntaxNode *)pEVar11;
  return pEVar11;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }